

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clparser_test.cc
# Opt level: O1

Test * CLParserTestParseSimple::Create(void)

{
  g_current_test = (Test *)operator_new(0x10);
  g_current_test->failed_ = false;
  g_current_test->assertion_failures_ = 0;
  g_current_test->_vptr_Test = (_func_int **)&PTR__Test_001f82c0;
  return g_current_test;
}

Assistant:

TEST(CLParserTest, ParseSimple) {
  CLParser parser;
  string output, err;
  ASSERT_TRUE(parser.Parse(
      "foo\r\n"
      "Note: inc file prefix:  foo.h\r\n"
      "bar\r\n",
      "Note: inc file prefix:", &output, &err));

  ASSERT_EQ("foo\nbar\n", output);
  ASSERT_EQ(1u, parser.includes_.size());
  ASSERT_EQ("foo.h", *parser.includes_.begin());
}